

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

void Saig_ManDupIsoCanonical_rec(Aig_Man_t *pNew,Aig_Man_t *pAig,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  Aig_Man_t *pNew_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 != 0) {
    return;
  }
  Aig_ObjSetTravIdCurrent(pAig,pObj);
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIso.c"
                  ,0x5e,"void Saig_ManDupIsoCanonical_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
  }
  pAVar2 = Aig_ObjFanin0(pObj);
  iVar1 = Aig_ObjIsNode(pAVar2);
  if (iVar1 != 0) {
    pAVar2 = Aig_ObjFanin1(pObj);
    iVar1 = Aig_ObjIsNode(pAVar2);
    if (iVar1 != 0) {
      pAVar2 = Aig_ObjFanin0(pObj);
      iVar1 = (pAVar2->field_5).iData;
      pAVar2 = Aig_ObjFanin1(pObj);
      if (iVar1 == (pAVar2->field_5).iData) {
        __assert_fail("Aig_ObjFanin0(pObj)->iData != Aig_ObjFanin1(pObj)->iData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIso.c"
                      ,0x66,
                      "void Saig_ManDupIsoCanonical_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar2 = Aig_ObjFanin0(pObj);
      iVar1 = (pAVar2->field_5).iData;
      pAVar2 = Aig_ObjFanin1(pObj);
      if (iVar1 < (pAVar2->field_5).iData) {
        pAVar2 = Aig_ObjFanin0(pObj);
        Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar2);
        pAVar2 = Aig_ObjFanin1(pObj);
        Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar2);
      }
      else {
        pAVar2 = Aig_ObjFanin1(pObj);
        Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar2);
        pAVar2 = Aig_ObjFanin0(pObj);
        Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar2);
      }
      goto LAB_008d798c;
    }
  }
  pAVar2 = Aig_ObjFanin0(pObj);
  Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar2);
  pAVar2 = Aig_ObjFanin1(pObj);
  Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar2);
LAB_008d798c:
  pAVar2 = Aig_ObjChild0Copy(pObj);
  p1 = Aig_ObjChild1Copy(pObj);
  pAVar2 = Aig_And(pNew,pAVar2,p1);
  (pObj->field_5).pData = pAVar2;
  return;
}

Assistant:

void Saig_ManDupIsoCanonical_rec( Aig_Man_t * pNew, Aig_Man_t * pAig, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    assert( Aig_ObjIsNode(pObj) );
    if ( !Aig_ObjIsNode(Aig_ObjFanin0(pObj)) || !Aig_ObjIsNode(Aig_ObjFanin1(pObj)) )
    {
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
    }
    else
    {
        assert( Aig_ObjFanin0(pObj)->iData != Aig_ObjFanin1(pObj)->iData );
        if ( Aig_ObjFanin0(pObj)->iData < Aig_ObjFanin1(pObj)->iData )
        {
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
        }
        else
        {
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
        }
    }
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
}